

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::TransitionTextureState
          (DeviceContextVkImpl *this,TextureVkImpl *TextureVk,RESOURCE_STATE OldState,
          RESOURCE_STATE NewState,STATE_TRANSITION_FLAGS Flags,VkImageSubresourceRange *pSubresRange
          )

{
  RESOURCE_STATE RVar1;
  VkBool32 VVar2;
  VkImage Image;
  VkImageAspectFlags VVar3;
  VkImageLayout NewLayout;
  VkPipelineStageFlags SrcStages;
  VkPipelineStageFlags DstStages;
  TextureFormatAttribs *pTVar4;
  char (*Args_1) [35];
  RESOURCE_STATE extraout_EDX;
  RESOURCE_STATE extraout_EDX_00;
  RESOURCE_STATE RVar5;
  RESOURCE_STATE State;
  undefined7 in_register_00000081;
  char (*Args_2) [64];
  VkImageLayout VVar6;
  undefined4 in_stack_ffffffffffffff48;
  string msg;
  VkImageSubresourceRange FullSubresRange;
  undefined4 uStack_5c;
  String local_50;
  
  Args_2 = (char (*) [64])CONCAT71(in_register_00000081,Flags);
  RVar5 = OldState;
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass.m_pObject !=
      (RenderPassVkImpl *)0x0) {
    FormatString<char[55]>
              (&msg,(char (*) [55])"State transitions are not allowed inside a render pass");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"TransitionTextureState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xbc9);
    RVar5 = extraout_EDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      RVar5 = extraout_EDX_00;
    }
  }
  RVar1 = (TextureVk->super_TextureBase<Diligent::EngineVkImplTraits>).m_State;
  if (OldState == RESOURCE_STATE_UNKNOWN) {
    OldState = RVar1;
    if (RVar1 == RESOURCE_STATE_UNKNOWN) {
      FormatString<char[44],char_const*,char[64]>
                (&msg,(Diligent *)"Failed to transition the state of texture \'",
                 (char (*) [44])
                 &(TextureVk->super_TextureBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                  .m_Desc,(char **)
                          "\' because the state is unknown and is not explicitly specified.",Args_2)
      ;
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
      }
      goto LAB_00291618;
    }
  }
  else if (RVar1 != OldState && RVar1 != RESOURCE_STATE_UNKNOWN) {
    GetResourceStateString_abi_cxx11_((String *)&FullSubresRange,(Diligent *)(ulong)RVar1,RVar5);
    GetResourceStateString_abi_cxx11_(&local_50,(Diligent *)(ulong)OldState,State);
    FormatString<char[11],std::__cxx11::string,char[14],char_const*,char[32],std::__cxx11::string,char[26]>
              (&msg,(Diligent *)"The state ",(char (*) [11])&FullSubresRange,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8136cc,
               (char (*) [14])
               &(TextureVk->super_TextureBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                .m_Desc,(char **)"\' does not match the old state ",(char (*) [32])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               " specified by the barrier",
               (char (*) [26])CONCAT44(NewState,in_stack_ffffffffffffff48));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((uint32_t *)FullSubresRange._0_8_ != &FullSubresRange.layerCount) {
      operator_delete((void *)FullSubresRange._0_8_,
                      CONCAT44(uStack_5c,FullSubresRange.layerCount) + 1);
    }
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  EnsureVkCmdBuffer(this);
  if (pSubresRange == (VkImageSubresourceRange *)0x0) {
    pSubresRange = &FullSubresRange;
    FullSubresRange.aspectMask = 0;
    FullSubresRange.baseMipLevel = 0;
    FullSubresRange.layerCount = 0xffffffff;
    FullSubresRange.levelCount = 0xffffffff;
    FullSubresRange.baseArrayLayer = 0;
  }
  Image = (TextureVk->m_VulkanImage).m_VkObject;
  if (pSubresRange->aspectMask == 0) {
    pTVar4 = GetTextureFormatAttribs
                       ((TextureVk->super_TextureBase<Diligent::EngineVkImplTraits>).
                        super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                        .m_Desc.Format);
    VVar3 = 2;
    if (pTVar4->ComponentType != COMPONENT_TYPE_DEPTH) {
      VVar3 = (uint)(pTVar4->ComponentType == COMPONENT_TYPE_DEPTH_STENCIL) * 5 + 1;
    }
    pSubresRange->aspectMask = VVar3;
  }
  VVar2 = (((((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject)->
            m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->m_EnabledExtFeatures).FragmentDensityMap.fragmentDensityMap;
  VVar6 = VK_IMAGE_LAYOUT_UNDEFINED;
  if ((Flags & STATE_TRANSITION_FLAG_DISCARD_CONTENT) == STATE_TRANSITION_FLAG_NONE) {
    VVar6 = ResourceStateToVkImageLayout(OldState,false,VVar2 != 0);
  }
  RVar5 = NewState;
  NewLayout = ResourceStateToVkImageLayout(NewState,false,VVar2 != 0);
  SrcStages = ResourceStateFlagsToVkPipelineStageFlags(OldState);
  DstStages = ResourceStateFlagsToVkPipelineStageFlags(NewState);
  if ((((OldState &
        (RESOURCE_STATE_BUILD_AS_WRITE|RESOURCE_STATE_RESOLVE_DEST|RESOURCE_STATE_COPY_DEST|
         RESOURCE_STATE_UNORDERED_ACCESS|RESOURCE_STATE_RENDER_TARGET)) == RESOURCE_STATE_UNKNOWN)
      && ((OldState & RVar5) == RVar5)) && (VVar6 == NewLayout)) {
    return;
  }
  Args_1 = (char (*) [35])(ulong)NewLayout;
  VulkanUtilities::VulkanCommandBuffer::TransitionImageLayout
            (&this->m_CommandBuffer,Image,VVar6,NewLayout,pSubresRange,SrcStages,DstStages);
  if ((Flags & STATE_TRANSITION_FLAG_UPDATE_STATE) == STATE_TRANSITION_FLAG_NONE) {
    return;
  }
  (TextureVk->super_TextureBase<Diligent::EngineVkImplTraits>).m_State = RVar5;
  VVar6 = TextureVkImpl::GetLayout(TextureVk);
  if (VVar6 == NewLayout) {
    return;
  }
  FormatString<char[26],char[35]>
            (&msg,(Diligent *)"Debug expression failed:\n",
             (char (*) [26])"TextureVk.GetLayout() == NewLayout",Args_1);
  DebugAssertionFailed
            (msg._M_dataplus._M_p,"TransitionTextureState",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
             ,0xc11);
LAB_00291618:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)msg._M_dataplus._M_p != &msg.field_2) {
    operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::TransitionTextureState(TextureVkImpl&           TextureVk,
                                                 RESOURCE_STATE           OldState,
                                                 RESOURCE_STATE           NewState,
                                                 STATE_TRANSITION_FLAGS   Flags,
                                                 VkImageSubresourceRange* pSubresRange /* = nullptr*/)
{
    VERIFY(m_pActiveRenderPass == nullptr, "State transitions are not allowed inside a render pass");
    if (OldState == RESOURCE_STATE_UNKNOWN)
    {
        if (TextureVk.IsInKnownState())
        {
            OldState = TextureVk.GetState();
        }
        else
        {
            LOG_ERROR_MESSAGE("Failed to transition the state of texture '", TextureVk.GetDesc().Name, "' because the state is unknown and is not explicitly specified.");
            return;
        }
    }
    else
    {
        if (TextureVk.IsInKnownState() && TextureVk.GetState() != OldState)
        {
            LOG_ERROR_MESSAGE("The state ", GetResourceStateString(TextureVk.GetState()), " of texture '",
                              TextureVk.GetDesc().Name, "' does not match the old state ", GetResourceStateString(OldState),
                              " specified by the barrier");
        }
    }

    EnsureVkCmdBuffer();

    VkImage vkImg = TextureVk.GetVkImage();

    VkImageSubresourceRange FullSubresRange;
    if (pSubresRange == nullptr)
    {
        pSubresRange = &FullSubresRange;

        FullSubresRange.aspectMask     = 0;
        FullSubresRange.baseArrayLayer = 0;
        FullSubresRange.layerCount     = VK_REMAINING_ARRAY_LAYERS;
        FullSubresRange.baseMipLevel   = 0;
        FullSubresRange.levelCount     = VK_REMAINING_MIP_LEVELS;
    }

    if (pSubresRange->aspectMask == 0)
    {
        const TextureDesc&          TexDesc    = TextureVk.GetDesc();
        const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(TexDesc.Format);
        if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH)
            pSubresRange->aspectMask = VK_IMAGE_ASPECT_DEPTH_BIT;
        else if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)
        {
            // If image has a depth / stencil format with both depth and stencil components, then the
            // aspectMask member of subresourceRange must include both VK_IMAGE_ASPECT_DEPTH_BIT and
            // VK_IMAGE_ASPECT_STENCIL_BIT
            pSubresRange->aspectMask = VK_IMAGE_ASPECT_DEPTH_BIT | VK_IMAGE_ASPECT_STENCIL_BIT;
        }
        else
            pSubresRange->aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
    }

    // Always add barrier after writes.
    const bool AfterWrite = ResourceStateHasWriteAccess(OldState);

    const auto&                ExtFeatures    = m_pDevice->GetLogicalDevice().GetEnabledExtFeatures();
    const bool                 FragDensityMap = ExtFeatures.FragmentDensityMap.fragmentDensityMap != VK_FALSE;
    const VkImageLayout        OldLayout      = (Flags & STATE_TRANSITION_FLAG_DISCARD_CONTENT) != 0 ? VK_IMAGE_LAYOUT_UNDEFINED : ResourceStateToVkImageLayout(OldState, /*IsInsideRenderPass = */ false, FragDensityMap);
    const VkImageLayout        NewLayout      = ResourceStateToVkImageLayout(NewState, /*IsInsideRenderPass = */ false, FragDensityMap);
    const VkPipelineStageFlags OldStages      = ResourceStateFlagsToVkPipelineStageFlags(OldState);
    const VkPipelineStageFlags NewStages      = ResourceStateFlagsToVkPipelineStageFlags(NewState);

    if (((OldState & NewState) != NewState) || OldLayout != NewLayout || AfterWrite)
    {
        m_CommandBuffer.TransitionImageLayout(vkImg, OldLayout, NewLayout, *pSubresRange, OldStages, NewStages);
        if ((Flags & STATE_TRANSITION_FLAG_UPDATE_STATE) != 0)
        {
            TextureVk.SetState(NewState);
            VERIFY_EXPR(TextureVk.GetLayout() == NewLayout);
        }
    }
}